

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

bool __thiscall rcg::System::isCharEncodingASCII(System *this)

{
  element_type *peVar1;
  int iVar2;
  int32_t v;
  INFO_DATATYPE type;
  size_t size;
  
  std::recursive_mutex::lock(&this->mtx);
  size = 4;
  peVar1 = (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (this->tl == (TL_HANDLE)0x0) {
    iVar2 = (*peVar1->GCGetInfo)(8,&type,&v,&size);
  }
  else {
    iVar2 = (*peVar1->TLGetInfo)(this->tl,8,&type,&v,&size);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return v == 0 || (type != 5 || iVar2 != 0);
}

Assistant:

bool System::isCharEncodingASCII()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  bool ret=true;

  GenTL::INFO_DATATYPE type;
  int32_t v;
  size_t size=sizeof(v);
  GenTL::GC_ERROR err=GenTL::GC_ERR_SUCCESS;

  if (tl != 0)
  {
    err=gentl->TLGetInfo(tl, GenTL::TL_INFO_CHAR_ENCODING, &type, &v, &size);
  }
  else
  {
    err=gentl->GCGetInfo(GenTL::TL_INFO_CHAR_ENCODING, &type, &v, &size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_INT32 &&
      v != GenTL::TL_CHAR_ENCODING_ASCII)
  {
    ret=false;
  }

  return ret;
}